

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O1

void __thiscall google::protobuf::io::CordOutputStream::BackUp(CordOutputStream *this,int count)

{
  byte bVar1;
  byte bVar2;
  sbyte sVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  size_t sVar7;
  sbyte sVar8;
  int iVar9;
  
  if (-1 < count) {
    uVar6 = (ulong)(this->cord_).contents_.data_.rep_.field_0.data[0];
    if ((uVar6 & 1) == 0) {
      uVar6 = uVar6 >> 1;
    }
    else {
      uVar6 = ((this->cord_).contents_.data_.rep_.field_0.as_tree.rep)->length;
    }
    bVar1 = (this->buffer_).rep_.field_0.short_rep.raw_size;
    if ((bVar1 & 1) == 0) {
      sVar7 = (((this->buffer_).rep_.field_0.long_rep.rep)->super_CordRep).length;
    }
    else {
      sVar7 = (size_t)((char)bVar1 >> 1);
    }
    if ((long)(ulong)(uint)count <= (long)(sVar7 + uVar6)) {
      if (count != 0) {
        if ((bVar1 & 1) == 0) {
          iVar4 = (int)(((this->buffer_).rep_.field_0.long_rep.rep)->super_CordRep).length;
        }
        else {
          iVar4 = (int)((char)bVar1 >> 1);
        }
        iVar5 = iVar4 - count;
        if (iVar4 < count) {
          __assert_fail("count <= buffer_length",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                        ,0x297,"virtual void google::protobuf::io::CordOutputStream::BackUp(int)");
        }
        uVar6 = 0xf;
        if ((bVar1 & 1) == 0) {
          bVar2 = (((this->buffer_).rep_.field_0.long_rep.rep)->super_CordRep).tag;
          iVar4 = -0xb8000;
          if (bVar2 < 0xbb) {
            iVar4 = -0xe80;
          }
          sVar8 = 0xc;
          if (bVar2 < 0xbb) {
            sVar8 = 6;
          }
          iVar9 = -0x10;
          if (0x42 < bVar2) {
            iVar9 = iVar4;
          }
          sVar3 = 3;
          if (0x42 < bVar2) {
            sVar3 = sVar8;
          }
          uVar6 = (ulong)(int)(((uint)bVar2 << sVar3) + iVar9 + -0xd);
        }
        if (uVar6 < (ulong)(long)iVar5) {
          BackUp();
          goto LAB_00220cfb;
        }
        if ((bVar1 & 1) == 0) {
          (((this->buffer_).rep_.field_0.long_rep.rep)->super_CordRep).length = (long)iVar5;
        }
        else {
          (this->buffer_).rep_.field_0.short_rep.raw_size = (char)iVar5 * '\x02' + '\x01';
        }
        this->state_ = kPartial;
      }
      return;
    }
  }
LAB_00220cfb:
  __assert_fail("0 <= count && count <= ByteCount()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                ,0x292,"virtual void google::protobuf::io::CordOutputStream::BackUp(int)");
}

Assistant:

void CordOutputStream::BackUp(int count) {
  // Check if something to do, else state remains unchanged.
  assert(0 <= count && count <= ByteCount());
  if (count == 0) return;

  // Backup() is not supposed to backup beyond last Next() call
  const int buffer_length = static_cast<int>(buffer_.length());
  assert(count <= buffer_length);
  if (count <= buffer_length) {
    buffer_.SetLength(static_cast<size_t>(buffer_length - count));
    state_ = State::kPartial;
  } else {
    buffer_ = {};
    cord_.RemoveSuffix(static_cast<size_t>(count));
    state_ = State::kSteal;
  }
}